

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O0

bool __thiscall
ftxui::anon_unknown_5::ResizableSplitRightBase::OnEvent(ResizableSplitRightBase *this,Event *event)

{
  bool bVar1;
  Event local_b0;
  Event local_60;
  Event *local_20;
  Event *event_local;
  ResizableSplitRightBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar1 = Event::is_mouse(event);
  if (bVar1) {
    Event::Event(&local_60,event);
    this_local._7_1_ = OnMouseEvent(this,&local_60);
    Event::~Event(&local_60);
  }
  else {
    Event::Event(&local_b0,event);
    this_local._7_1_ = ComponentBase::OnEvent(&this->super_ComponentBase,&local_b0);
    Event::~Event(&local_b0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(std::move(event));
    return ComponentBase::OnEvent(std::move(event));
  }